

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::AssertionPrinter::printIssue(AssertionPrinter *this,char *issue)

{
  ostream *poVar1;
  char *in_RSI;
  undefined8 *in_RDI;
  
  poVar1 = std::operator<<((ostream *)*in_RDI,' ');
  std::operator<<(poVar1,in_RSI);
  return;
}

Assistant:

void printIssue(char const* issue) const {
        stream << ' ' << issue;
    }